

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classloader.cpp
# Opt level: O0

InnerClasses_attribute __thiscall ClassLoader::getAttributeInnerClasses(ClassLoader *this,FILE *fp)

{
  Class *pCVar1;
  Class CVar2;
  InnerClasses_attribute IVar3;
  ushort local_2a;
  u2 i;
  FILE *fp_local;
  ClassLoader *this_local;
  InnerClasses_attribute result;
  
  IVar3.number_of_classes = readU2(this,fp);
  pCVar1 = (Class *)malloc((ulong)IVar3.number_of_classes << 3);
  for (local_2a = 0; local_2a < IVar3.number_of_classes; local_2a = local_2a + 1) {
    CVar2 = getClass(this,fp);
    pCVar1[local_2a] = CVar2;
  }
  IVar3._2_6_ = 0;
  IVar3.classes = pCVar1;
  return IVar3;
}

Assistant:

InnerClasses_attribute ClassLoader::getAttributeInnerClasses(FILE *fp) {
    InnerClasses_attribute result;
    result.number_of_classes = readU2(fp);
    result.classes = (Class*) malloc(sizeof(Class) * result.number_of_classes);
    for (u2 i = 0; i < result.number_of_classes; i++) {
        result.classes[i] = getClass(fp);
    }
    return result;
}